

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

worker_t * __thiscall
acto::intrusive::mpsc_stack<acto::core::worker_t>::pop(mpsc_stack<acto::core::worker_t> *this)

{
  bool bVar1;
  worker_t *next;
  worker_t *top;
  mpsc_stack<acto::core::worker_t> *this_local;
  
  top = (worker_t *)this;
  do {
    next = std::atomic<acto::core::worker_t_*>::load(&this->head_,consume);
    if (next == (__pointer_type)0x0) {
      return (worker_t *)0x0;
    }
    bVar1 = std::atomic<acto::core::worker_t_*>::compare_exchange_weak
                      (&this->head_,&next,(next->super_node<acto::core::worker_t>).next,seq_cst);
  } while (!bVar1);
  (next->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
  return next;
}

Assistant:

T* pop() noexcept {
    do {
      T* top = head_.load(std::memory_order_consume);
      // Check the stack is empty.
      if (top == nullptr) {
        return nullptr;
      }

      T* next = top->next;
      // Pop the item.
      if (head_.compare_exchange_weak(top, next)) {
        top->next = nullptr;
        return top;
      }
    } while (true);
  }